

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

IVec4 tcu::getChannelBitDepth(ChannelType channelType)

{
  long in_RAX;
  undefined8 in_RDX;
  undefined4 *in_RDI;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  IVec4 IVar5;
  
  if (channelType < CHANNELTYPE_LAST) {
    in_RAX = (long)&switchD_005e503a::switchdataD_0068c0a0 +
             (long)(int)(&switchD_005e503a::switchdataD_0068c0a0)[channelType];
    switch(channelType) {
    case SNORM_INT8:
    case UNORM_INT8:
    case SIGNED_INT8:
    case UNSIGNED_INT8:
      uVar1 = 8;
      uVar2 = 8;
      uVar3 = 8;
      uVar4 = 8;
      break;
    default:
      uVar1 = 0x10;
      uVar2 = 0x10;
      uVar3 = 0x10;
      uVar4 = 0x10;
      break;
    case SNORM_INT32:
    case UNORM_INT32:
    case SIGNED_INT32:
    case UNSIGNED_INT32:
    case FLOAT:
      uVar1 = 0x20;
      uVar2 = 0x20;
      uVar3 = 0x20;
      uVar4 = 0x20;
      break;
    case UNORM_INT24:
    case UNSIGNED_INT24:
      uVar1 = 0x18;
      uVar2 = 0x18;
      uVar3 = 0x18;
      uVar4 = 0x18;
      break;
    case UNORM_BYTE_44:
    case UNSIGNED_BYTE_44:
      uVar1 = 4;
      uVar2 = 4;
      uVar3 = 0;
      uVar4 = 0;
      break;
    case UNORM_SHORT_565:
    case UNSIGNED_SHORT_565:
      uVar1 = 5;
      uVar2 = 6;
      uVar3 = 5;
      uVar4 = 0;
      break;
    case UNORM_SHORT_555:
      uVar1 = 5;
      uVar2 = 5;
      uVar3 = 5;
      uVar4 = 0;
      break;
    case UNORM_SHORT_4444:
    case UNSIGNED_SHORT_4444:
      uVar1 = 4;
      uVar2 = 4;
      uVar3 = 4;
      uVar4 = 4;
      break;
    case UNORM_SHORT_5551:
    case UNSIGNED_SHORT_5551:
      uVar1 = 5;
      uVar2 = 5;
      uVar3 = 5;
      uVar4 = 1;
      break;
    case UNORM_SHORT_1555:
      uVar1 = 1;
      uVar2 = 5;
      uVar3 = 5;
      uVar4 = 5;
      break;
    case UNORM_INT_101010:
      uVar1 = 10;
      uVar2 = 10;
      uVar3 = 10;
      uVar4 = 0;
      break;
    case SNORM_INT_1010102_REV:
    case UNORM_INT_1010102_REV:
    case SIGNED_INT_1010102_REV:
    case UNSIGNED_INT_1010102_REV:
      uVar1 = 10;
      uVar2 = 10;
      uVar3 = 10;
      uVar4 = 2;
      break;
    case UNSIGNED_INT_11F_11F_10F_REV:
      uVar1 = 0xb;
      uVar2 = 0xb;
      uVar3 = 10;
      uVar4 = 0;
      break;
    case UNSIGNED_INT_999_E5_REV:
      uVar1 = 9;
      uVar2 = 9;
      uVar3 = 9;
      uVar4 = 0;
      break;
    case UNSIGNED_INT_16_8_8:
      uVar1 = 0x10;
      uVar2 = 8;
      uVar3 = 0;
      uVar4 = 0;
      break;
    case UNSIGNED_INT_24_8:
    case UNSIGNED_INT_24_8_REV:
      uVar1 = 0x18;
      uVar2 = 8;
      uVar3 = 0;
      uVar4 = 0;
      break;
    case FLOAT64:
      uVar1 = 0x40;
      uVar2 = 0x40;
      uVar3 = 0x40;
      uVar4 = 0x40;
      break;
    case FLOAT_UNSIGNED_INT_24_8_REV:
      uVar1 = 0x20;
      uVar2 = 8;
      uVar3 = 0;
      uVar4 = 0;
    }
  }
  else {
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
  }
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  IVar5.m_data._8_8_ = in_RDX;
  IVar5.m_data[0] = (int)in_RAX;
  IVar5.m_data[1] = (int)((ulong)in_RAX >> 0x20);
  return (IVec4)IVar5.m_data;
}

Assistant:

static IVec4 getChannelBitDepth (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (channelType)
	{
		case TextureFormat::SNORM_INT8:						return IVec4(8);
		case TextureFormat::SNORM_INT16:					return IVec4(16);
		case TextureFormat::SNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_INT8:						return IVec4(8);
		case TextureFormat::UNORM_INT16:					return IVec4(16);
		case TextureFormat::UNORM_INT24:					return IVec4(24);
		case TextureFormat::UNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_BYTE_44:					return IVec4(4,4,0,0);
		case TextureFormat::UNORM_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNORM_SHORT_4444:				return IVec4(4);
		case TextureFormat::UNORM_SHORT_555:				return IVec4(5,5,5,0);
		case TextureFormat::UNORM_SHORT_5551:				return IVec4(5,5,5,1);
		case TextureFormat::UNORM_SHORT_1555:				return IVec4(1,5,5,5);
		case TextureFormat::UNSIGNED_BYTE_44:				return IVec4(4,4,0,0);
		case TextureFormat::UNSIGNED_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNSIGNED_SHORT_4444:			return IVec4(4);
		case TextureFormat::UNSIGNED_SHORT_5551:			return IVec4(5,5,5,1);
		case TextureFormat::UNORM_INT_101010:				return IVec4(10,10,10,0);
		case TextureFormat::SNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::SIGNED_INT8:					return IVec4(8);
		case TextureFormat::SIGNED_INT16:					return IVec4(16);
		case TextureFormat::SIGNED_INT32:					return IVec4(32);
		case TextureFormat::UNSIGNED_INT8:					return IVec4(8);
		case TextureFormat::UNSIGNED_INT16:					return IVec4(16);
		case TextureFormat::UNSIGNED_INT24:					return IVec4(24);
		case TextureFormat::UNSIGNED_INT32:					return IVec4(32);
		case TextureFormat::SIGNED_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_1010102_REV:		return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_16_8_8:			return IVec4(16,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8:				return IVec4(24,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8_REV:			return IVec4(24,8,0,0);
		case TextureFormat::HALF_FLOAT:						return IVec4(16);
		case TextureFormat::FLOAT:							return IVec4(32);
		case TextureFormat::FLOAT64:						return IVec4(64);
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	return IVec4(11,11,10,0);
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		return IVec4(9,9,9,0);
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return IVec4(32,8,0,0);
		default:
			DE_ASSERT(false);
			return IVec4(0);
	}
}